

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void clear_advisor_read_lock(char *filename)

{
  int iVar1;
  uint *puVar2;
  char *pcVar3;
  bool bVar4;
  uint local_14;
  int res;
  int error;
  char *filename_local;
  
  local_14 = 0;
  do {
    iVar1 = unlink(filename);
    bVar4 = false;
    if (iVar1 != 0) {
      puVar2 = (uint *)__errno_location();
      local_14 = *puVar2;
      bVar4 = local_14 == 4;
    }
  } while (bVar4);
  if (iVar1 != 0) {
    pcVar3 = strerror(local_14);
    logmsg("Error removing lock file %s error: %d %s",filename,(ulong)local_14,pcVar3);
  }
  return;
}

Assistant:

void clear_advisor_read_lock(const char *filename)
{
  int error = 0;
  int res;

  /*
  ** Log all removal failures. Even those due to file not existing.
  ** This allows to detect if unexpectedly the file has already been
  ** removed by a process different than the one that should do this.
  */

  do {
    res = unlink(filename);
  } while(res && ((error = errno) == EINTR));
  if(res)
    logmsg("Error removing lock file %s error: %d %s",
           filename, error, strerror(error));
}